

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameUnmapExprCb(Walker *pWalker,Expr *pExpr)

{
  Parse *pParse;
  
  pParse = pWalker->pParse;
  sqlite3RenameTokenRemap(pParse,(void *)0x0,pExpr);
  if ((pExpr->flags & 0x3000000) == 0) {
    sqlite3RenameTokenRemap(pParse,(void *)0x0,&pExpr->y);
  }
  return 0;
}

Assistant:

static int renameUnmapExprCb(Walker *pWalker, Expr *pExpr){
  Parse *pParse = pWalker->pParse;
  sqlite3RenameTokenRemap(pParse, 0, (const void*)pExpr);
  if( ExprUseYTab(pExpr) ){
    sqlite3RenameTokenRemap(pParse, 0, (const void*)&pExpr->y.pTab);
  }
  return WRC_Continue;
}